

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transpose.cpp
# Opt level: O2

void test_qclab_dense_transpose<double>(void)

{
  char *pcVar1;
  AssertionResult gtest_ar_2;
  M m5;
  M m3;
  AssertHelper local_d0;
  AssertionResult gtest_ar_7;
  M m2;
  AssertHelper local_a8;
  M m1;
  M matrix2;
  M check2T;
  M matrix1;
  M check1T;
  M check2;
  M check1;
  
  qclab::dense::SquareMatrix<double>::SquareMatrix(&matrix1,1.0,2.0,3.0,4.0);
  qclab::dense::SquareMatrix<double>::SquareMatrix
            (&matrix2,1.0,5.0,9.0,13.0,2.0,6.0,10.0,14.0,3.0,7.0,11.0,15.0,4.0,8.0,12.0,16.0);
  qclab::dense::SquareMatrix<double>::SquareMatrix(&check1,1.0,2.0,3.0,4.0);
  qclab::dense::SquareMatrix<double>::SquareMatrix
            (&check2,1.0,5.0,9.0,13.0,2.0,6.0,10.0,14.0,3.0,7.0,11.0,15.0,4.0,8.0,12.0,16.0);
  qclab::dense::SquareMatrix<double>::SquareMatrix(&check1T,1.0,3.0,2.0,4.0);
  qclab::dense::SquareMatrix<double>::SquareMatrix
            (&check2T,1.0,2.0,3.0,4.0,5.0,6.0,7.0,8.0,9.0,10.0,11.0,12.0,13.0,14.0,15.0,16.0);
  qclab::dense::SquareMatrix<double>::SquareMatrix(&m1,&matrix1);
  testing::internal::
  CmpHelperEQ<qclab::dense::SquareMatrix<double>,qclab::dense::SquareMatrix<double>>
            ((internal *)&m2,"m1","check1",&m1,&check1);
  if ((char)m2.size_ == '\0') {
    testing::Message::Message((Message *)&m3);
    if ((__uniq_ptr_impl<double,_std::default_delete<double[]>_>)
        m2.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
        super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
        super__Head_base<0UL,_double_*,_false>._M_head_impl ==
        (__uniq_ptr_impl<double,_std::default_delete<double[]>_>)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = *(char **)m2.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>
                         ._M_t.super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                         super__Head_base<0UL,_double_*,_false>._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/transpose.cpp"
               ,0x24,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2,(Message *)&m3);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2);
    if ((long *)CONCAT71(m3.size_._1_7_,(char)m3.size_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(m3.size_._1_7_,(char)m3.size_) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&m2.data_);
  qclab::dense::SquareMatrix<double>::SquareMatrix(&m2,&matrix2);
  testing::internal::
  CmpHelperEQ<qclab::dense::SquareMatrix<double>,qclab::dense::SquareMatrix<double>>
            ((internal *)&m3,"m2","check2",&m2,&check2);
  if ((char)m3.size_ == '\0') {
    testing::Message::Message((Message *)&gtest_ar_2);
    if ((__uniq_ptr_impl<double,_std::default_delete<double[]>_>)
        m3.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
        super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
        super__Head_base<0UL,_double_*,_false>._M_head_impl ==
        (__uniq_ptr_impl<double,_std::default_delete<double[]>_>)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = *(char **)m3.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>
                         ._M_t.super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                         super__Head_base<0UL,_double_*,_false>._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&m5,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/transpose.cpp"
               ,0x27,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)&m5,(Message *)&gtest_ar_2);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&m5);
    if ((long *)CONCAT71(gtest_ar_2._1_7_,gtest_ar_2.success_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(gtest_ar_2._1_7_,gtest_ar_2.success_) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&m3.data_);
  qclab::dense::operate<qclab::dense::SquareMatrix<double>>((dense *)&m3,NoTrans,&matrix2);
  testing::internal::
  CmpHelperEQ<qclab::dense::SquareMatrix<double>,qclab::dense::SquareMatrix<double>>
            ((internal *)&gtest_ar_2,"m3","check2",&m3,&check2);
  if (gtest_ar_2.success_ == false) {
    testing::Message::Message((Message *)&m5);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar_2.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = *(char **)gtest_ar_2.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_7,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/transpose.cpp"
               ,0x29,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_7,(Message *)&m5);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_7);
    if ((long *)CONCAT71(m5.size_._1_7_,(char)m5.size_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(m5.size_._1_7_,(char)m5.size_) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_2.message_);
  std::unique_ptr<double[],_std::default_delete<double[]>_>::~unique_ptr(&m3.data_);
  std::unique_ptr<double[],_std::default_delete<double[]>_>::~unique_ptr(&m2.data_);
  std::unique_ptr<double[],_std::default_delete<double[]>_>::~unique_ptr(&m1.data_);
  qclab::dense::SquareMatrix<double>::SquareMatrix(&m1,&matrix1);
  qclab::dense::operateInPlace<qclab::dense::SquareMatrix<double>>(Trans,&m1);
  testing::internal::
  CmpHelperEQ<qclab::dense::SquareMatrix<double>,qclab::dense::SquareMatrix<double>>
            ((internal *)&m2,"m1","check1T",&m1,&check1T);
  if ((char)m2.size_ == '\0') {
    testing::Message::Message((Message *)&m3);
    if ((__uniq_ptr_impl<double,_std::default_delete<double[]>_>)
        m2.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
        super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
        super__Head_base<0UL,_double_*,_false>._M_head_impl ==
        (__uniq_ptr_impl<double,_std::default_delete<double[]>_>)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = *(char **)m2.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>
                         ._M_t.super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                         super__Head_base<0UL,_double_*,_false>._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/transpose.cpp"
               ,0x30,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2,(Message *)&m3);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2);
    if ((long *)CONCAT71(m3.size_._1_7_,(char)m3.size_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(m3.size_._1_7_,(char)m3.size_) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&m2.data_);
  qclab::dense::SquareMatrix<double>::SquareMatrix(&m2,&matrix2);
  qclab::dense::operateInPlace<qclab::dense::SquareMatrix<double>>(Trans,&m2);
  testing::internal::
  CmpHelperEQ<qclab::dense::SquareMatrix<double>,qclab::dense::SquareMatrix<double>>
            ((internal *)&m3,"m2","check2T",&m2,&check2T);
  if ((char)m3.size_ == '\0') {
    testing::Message::Message((Message *)&gtest_ar_2);
    if ((__uniq_ptr_impl<double,_std::default_delete<double[]>_>)
        m3.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
        super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
        super__Head_base<0UL,_double_*,_false>._M_head_impl ==
        (__uniq_ptr_impl<double,_std::default_delete<double[]>_>)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = *(char **)m3.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>
                         ._M_t.super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                         super__Head_base<0UL,_double_*,_false>._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&m5,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/transpose.cpp"
               ,0x33,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)&m5,(Message *)&gtest_ar_2);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&m5);
    if ((long *)CONCAT71(gtest_ar_2._1_7_,gtest_ar_2.success_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(gtest_ar_2._1_7_,gtest_ar_2.success_) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&m3.data_);
  qclab::dense::operate<qclab::dense::SquareMatrix<double>>((dense *)&m3,Trans,&matrix2);
  testing::internal::
  CmpHelperEQ<qclab::dense::SquareMatrix<double>,qclab::dense::SquareMatrix<double>>
            ((internal *)&gtest_ar_2,"m3","check2T",&m3,&check2T);
  if (gtest_ar_2.success_ == false) {
    testing::Message::Message((Message *)&m5);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar_2.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = *(char **)gtest_ar_2.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_7,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/transpose.cpp"
               ,0x35,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_7,(Message *)&m5);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_7);
    if ((long *)CONCAT71(m5.size_._1_7_,(char)m5.size_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(m5.size_._1_7_,(char)m5.size_) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_2.message_);
  qclab::dense::SquareMatrix<double>::SquareMatrix((SquareMatrix<double> *)&gtest_ar_2,&matrix2);
  qclab::dense::transInPlace<qclab::dense::SquareMatrix<double>>
            ((SquareMatrix<double> *)&gtest_ar_2);
  testing::internal::
  CmpHelperEQ<qclab::dense::SquareMatrix<double>,qclab::dense::SquareMatrix<double>>
            ((internal *)&m5,"m4","check2T",(SquareMatrix<double> *)&gtest_ar_2,&check2T);
  if ((char)m5.size_ == '\0') {
    testing::Message::Message((Message *)&gtest_ar_7);
    if ((__uniq_ptr_impl<double,_std::default_delete<double[]>_>)
        m5.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
        super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
        super__Head_base<0UL,_double_*,_false>._M_head_impl ==
        (__uniq_ptr_impl<double,_std::default_delete<double[]>_>)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = *(char **)m5.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>
                         ._M_t.super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                         super__Head_base<0UL,_double_*,_false>._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/transpose.cpp"
               ,0x38,pcVar1);
    testing::internal::AssertHelper::operator=(&local_d0,(Message *)&gtest_ar_7);
    testing::internal::AssertHelper::~AssertHelper(&local_d0);
    if ((long *)CONCAT71(gtest_ar_7._1_7_,gtest_ar_7.success_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(gtest_ar_7._1_7_,gtest_ar_7.success_) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&m5.data_);
  qclab::dense::trans<qclab::dense::SquareMatrix<double>>((dense *)&m5,&matrix2);
  testing::internal::
  CmpHelperEQ<qclab::dense::SquareMatrix<double>,qclab::dense::SquareMatrix<double>>
            ((internal *)&gtest_ar_7,"m5","check2T",&m5,&check2T);
  if (gtest_ar_7.success_ == false) {
    testing::Message::Message((Message *)&local_d0);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar_7.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = *(char **)gtest_ar_7.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/transpose.cpp"
               ,0x3a,pcVar1);
    testing::internal::AssertHelper::operator=(&local_a8,(Message *)&local_d0);
    testing::internal::AssertHelper::~AssertHelper(&local_a8);
    if (local_d0.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_d0.data_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_7.message_);
  std::unique_ptr<double[],_std::default_delete<double[]>_>::~unique_ptr(&m5.data_);
  std::unique_ptr<double[],_std::default_delete<double[]>_>::~unique_ptr
            ((unique_ptr<double[],_std::default_delete<double[]>_> *)&gtest_ar_2.message_);
  std::unique_ptr<double[],_std::default_delete<double[]>_>::~unique_ptr(&m3.data_);
  std::unique_ptr<double[],_std::default_delete<double[]>_>::~unique_ptr(&m2.data_);
  std::unique_ptr<double[],_std::default_delete<double[]>_>::~unique_ptr(&m1.data_);
  qclab::dense::SquareMatrix<double>::SquareMatrix(&m1,&matrix1);
  qclab::dense::operateInPlace<qclab::dense::SquareMatrix<double>>(ConjTrans,&m1);
  testing::internal::
  CmpHelperEQ<qclab::dense::SquareMatrix<double>,qclab::dense::SquareMatrix<double>>
            ((internal *)&m2,"m1","check1T",&m1,&check1T);
  if ((char)m2.size_ == '\0') {
    testing::Message::Message((Message *)&m3);
    if ((__uniq_ptr_impl<double,_std::default_delete<double[]>_>)
        m2.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
        super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
        super__Head_base<0UL,_double_*,_false>._M_head_impl ==
        (__uniq_ptr_impl<double,_std::default_delete<double[]>_>)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = *(char **)m2.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>
                         ._M_t.super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                         super__Head_base<0UL,_double_*,_false>._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/transpose.cpp"
               ,0x41,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2,(Message *)&m3);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2);
    if ((long *)CONCAT71(m3.size_._1_7_,(char)m3.size_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(m3.size_._1_7_,(char)m3.size_) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&m2.data_);
  qclab::dense::SquareMatrix<double>::SquareMatrix(&m2,&matrix2);
  qclab::dense::operateInPlace<qclab::dense::SquareMatrix<double>>(ConjTrans,&m2);
  testing::internal::
  CmpHelperEQ<qclab::dense::SquareMatrix<double>,qclab::dense::SquareMatrix<double>>
            ((internal *)&m3,"m2","check2T",&m2,&check2T);
  if ((char)m3.size_ == '\0') {
    testing::Message::Message((Message *)&gtest_ar_2);
    if ((__uniq_ptr_impl<double,_std::default_delete<double[]>_>)
        m3.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
        super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
        super__Head_base<0UL,_double_*,_false>._M_head_impl ==
        (__uniq_ptr_impl<double,_std::default_delete<double[]>_>)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = *(char **)m3.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>
                         ._M_t.super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                         super__Head_base<0UL,_double_*,_false>._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&m5,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/transpose.cpp"
               ,0x44,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)&m5,(Message *)&gtest_ar_2);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&m5);
    if ((long *)CONCAT71(gtest_ar_2._1_7_,gtest_ar_2.success_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(gtest_ar_2._1_7_,gtest_ar_2.success_) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&m3.data_);
  qclab::dense::operate<qclab::dense::SquareMatrix<double>>((dense *)&m3,ConjTrans,&matrix2);
  testing::internal::
  CmpHelperEQ<qclab::dense::SquareMatrix<double>,qclab::dense::SquareMatrix<double>>
            ((internal *)&gtest_ar_2,"m3","check2T",&m3,&check2T);
  if (gtest_ar_2.success_ == false) {
    testing::Message::Message((Message *)&m5);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar_2.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = *(char **)gtest_ar_2.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_7,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/transpose.cpp"
               ,0x46,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_7,(Message *)&m5);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_7);
    if ((long *)CONCAT71(m5.size_._1_7_,(char)m5.size_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(m5.size_._1_7_,(char)m5.size_) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_2.message_);
  qclab::dense::SquareMatrix<double>::SquareMatrix((SquareMatrix<double> *)&gtest_ar_2,&matrix2);
  qclab::dense::conjTransInPlace<qclab::dense::SquareMatrix<double>>
            ((SquareMatrix<double> *)&gtest_ar_2);
  testing::internal::
  CmpHelperEQ<qclab::dense::SquareMatrix<double>,qclab::dense::SquareMatrix<double>>
            ((internal *)&m5,"m4","check2T",(SquareMatrix<double> *)&gtest_ar_2,&check2T);
  if ((char)m5.size_ == '\0') {
    testing::Message::Message((Message *)&gtest_ar_7);
    if ((__uniq_ptr_impl<double,_std::default_delete<double[]>_>)
        m5.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
        super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
        super__Head_base<0UL,_double_*,_false>._M_head_impl ==
        (__uniq_ptr_impl<double,_std::default_delete<double[]>_>)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = *(char **)m5.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>
                         ._M_t.super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                         super__Head_base<0UL,_double_*,_false>._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/transpose.cpp"
               ,0x49,pcVar1);
    testing::internal::AssertHelper::operator=(&local_d0,(Message *)&gtest_ar_7);
    testing::internal::AssertHelper::~AssertHelper(&local_d0);
    if ((long *)CONCAT71(gtest_ar_7._1_7_,gtest_ar_7.success_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(gtest_ar_7._1_7_,gtest_ar_7.success_) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&m5.data_);
  qclab::dense::conjTrans<qclab::dense::SquareMatrix<double>>((dense *)&m5,&matrix2);
  testing::internal::
  CmpHelperEQ<qclab::dense::SquareMatrix<double>,qclab::dense::SquareMatrix<double>>
            ((internal *)&gtest_ar_7,"m5","check2T",&m5,&check2T);
  if (gtest_ar_7.success_ == false) {
    testing::Message::Message((Message *)&local_d0);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar_7.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = *(char **)gtest_ar_7.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/transpose.cpp"
               ,0x4b,pcVar1);
    testing::internal::AssertHelper::operator=(&local_a8,(Message *)&local_d0);
    testing::internal::AssertHelper::~AssertHelper(&local_a8);
    if (local_d0.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_d0.data_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_7.message_);
  std::unique_ptr<double[],_std::default_delete<double[]>_>::~unique_ptr(&m5.data_);
  std::unique_ptr<double[],_std::default_delete<double[]>_>::~unique_ptr
            ((unique_ptr<double[],_std::default_delete<double[]>_> *)&gtest_ar_2.message_);
  std::unique_ptr<double[],_std::default_delete<double[]>_>::~unique_ptr(&m3.data_);
  std::unique_ptr<double[],_std::default_delete<double[]>_>::~unique_ptr(&m2.data_);
  std::unique_ptr<double[],_std::default_delete<double[]>_>::~unique_ptr(&m1.data_);
  std::unique_ptr<double[],_std::default_delete<double[]>_>::~unique_ptr(&check2T.data_);
  std::unique_ptr<double[],_std::default_delete<double[]>_>::~unique_ptr(&check1T.data_);
  std::unique_ptr<double[],_std::default_delete<double[]>_>::~unique_ptr(&check2.data_);
  std::unique_ptr<double[],_std::default_delete<double[]>_>::~unique_ptr(&check1.data_);
  std::unique_ptr<double[],_std::default_delete<double[]>_>::~unique_ptr(&matrix2.data_);
  std::unique_ptr<double[],_std::default_delete<double[]>_>::~unique_ptr(&matrix1.data_);
  return;
}

Assistant:

void test_qclab_dense_transpose() {

  using M = qclab::dense::SquareMatrix< T > ;

  M matrix1( 1 , 2 ,
             3 , 4 ) ;
  M matrix2( 1 , 5 ,  9 , 13 ,
             2 , 6 , 10 , 14 ,
             3 , 7 , 11 , 15 ,
             4 , 8 , 12 , 16 ) ;

  M check1( 1 , 2 ,
            3 , 4 ) ;
  M check2( 1 , 5 ,  9 , 13 ,
            2 , 6 , 10 , 14 ,
            3 , 7 , 11 , 15 ,
            4 , 8 , 12 , 16 ) ;

  M check1T( 1 , 3 ,
             2 , 4 ) ;
  M check2T(  1 ,  2 ,  3 ,  4 ,
              5 ,  6 ,  7 ,  8 ,
              9 , 10 , 11 , 12 ,
             13 , 14 , 15 , 16 ) ;

  // NoTrans
  {
    M m1( matrix1 ) ;
    qclab::dense::operateInPlace( qclab::Op::NoTrans , m1 ) ;
    EXPECT_EQ( m1 , check1 ) ;
    M m2( matrix2 ) ;
    qclab::dense::operateInPlace( qclab::Op::NoTrans , m2 ) ;
    EXPECT_EQ( m2 , check2 ) ;
    M m3 = qclab::dense::operate( qclab::Op::NoTrans , matrix2 ) ;
    EXPECT_EQ( m3 , check2 ) ;
  }

  // Trans
  {
    M m1( matrix1 ) ;
    qclab::dense::operateInPlace( qclab::Op::Trans , m1 ) ;
    EXPECT_EQ( m1 , check1T ) ;
    M m2( matrix2 ) ;
    qclab::dense::operateInPlace( qclab::Op::Trans , m2 ) ;
    EXPECT_EQ( m2 , check2T ) ;
    M m3 = qclab::dense::operate( qclab::Op::Trans , matrix2 ) ;
    EXPECT_EQ( m3 , check2T ) ;
    M m4( matrix2 ) ;
    qclab::dense::transInPlace( m4 ) ;
    EXPECT_EQ( m4 , check2T ) ;
    M m5 = qclab::dense::trans( matrix2 ) ;
    EXPECT_EQ( m5 , check2T ) ;
  }

  // ConjTrans
  {
    M m1( matrix1 ) ;
    qclab::dense::operateInPlace( qclab::Op::ConjTrans , m1 ) ;
    EXPECT_EQ( m1 , check1T ) ;
    M m2( matrix2 ) ;
    qclab::dense::operateInPlace( qclab::Op::ConjTrans , m2 ) ;
    EXPECT_EQ( m2 , check2T ) ;
    M m3 = qclab::dense::operate( qclab::Op::ConjTrans , matrix2 ) ;
    EXPECT_EQ( m3 , check2T ) ;
    M m4( matrix2 ) ;
    qclab::dense::conjTransInPlace( m4 ) ;
    EXPECT_EQ( m4 , check2T ) ;
    M m5 = qclab::dense::conjTrans( matrix2 ) ;
    EXPECT_EQ( m5 , check2T ) ;
  }

}